

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_CCtxParams_init_advanced
                 (ZSTD_CCtx_params *cctxParams,ZSTD_parameters params)

{
  undefined4 in_EAX;
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  if (cctxParams == (ZSTD_CCtx_params *)0x0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    auVar3._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
    auVar3._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
    auVar3._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
    auVar3._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
    iVar1 = movmskps(in_EAX,auVar3);
    uVar2 = 0xffffffffffffffd6;
    if ((((iVar1 == 0xf) && (0xfffffffa < params.cParams.minMatch - 8)) &&
        (params.cParams.targetLength < 0x20001)) &&
       (0xfffffff6 < params.cParams.strategy + ~ZSTD_btultra2)) {
      uVar2 = 0;
    }
    if (uVar2 < 0xffffffffffffff89) {
      uVar2 = 0;
      ZSTD_CCtxParams_init_internal(cctxParams,&params,0);
    }
  }
  return uVar2;
}

Assistant:

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params* cctxParams, ZSTD_parameters params)
{
    RETURN_ERROR_IF(!cctxParams, GENERIC, "NULL pointer!");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_init_internal(cctxParams, &params, ZSTD_NO_CLEVEL);
    return 0;
}